

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O2

void __thiscall jbcoin::STAmount::STAmount(STAmount *this,XRPAmount *amount)

{
  mantissa_type mVar1;
  mantissa_type mVar2;
  
  (this->super_STBase).fName = (SField *)sfGeneric;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
  (this->mIssue).currency.pn[0] = 0;
  (this->mIssue).currency.pn[1] = 0;
  (this->mIssue).currency.pn[2] = 0;
  (this->mIssue).currency.pn[3] = 0;
  (this->mIssue).account.pn[3] = 0;
  (this->mIssue).account.pn[4] = 0;
  *(undefined8 *)((this->mIssue).currency.pn + 4) = 0;
  (this->mIssue).account.pn[1] = 0;
  (this->mIssue).account.pn[2] = 0;
  this->mOffset = 0;
  this->mIsNative = true;
  mVar1 = amount->drops_;
  this->mIsNegative = SUB81(mVar1 >> 0x3f,0);
  mVar2 = -mVar1;
  if (0 < (long)mVar1) {
    mVar2 = mVar1;
  }
  this->mValue = mVar2;
  canonicalize(this);
  return;
}

Assistant:

STBase::STBase()
    : fName(&sfGeneric)
{
}